

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_lzop.c
# Opt level: O0

void test_compat_lzop(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *paVar3;
  char *pcVar4;
  la_int64_t lVar5;
  int r;
  archive *a;
  archive_entry *ae;
  char *sample3;
  char *sample2;
  char *sample1;
  
  sample2 = "test_compat_lzop_1.tar.lzo";
  sample3 = "test_compat_lzop_2.tar.lzo";
  ae = (archive_entry *)anon_var_dwarf_11d0e;
  paVar3 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                   ,L'1',(uint)(paVar3 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                      ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_support_filter_lzop((archive *)paVar3);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                   ,L'5');
    test_skipping("lzop reading not fully supported on this platform");
    iVar1 = archive_read_free((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'6',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    iVar1 = archive_read_support_format_all((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'9',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3
                       );
    extract_reference_file(sample2);
    wVar2 = archive_read_open_filename(paVar3,sample2,2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'<',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, sample1, 2)"
                        ,paVar3);
    iVar1 = archive_read_next_header((archive *)paVar3,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
               ,L'?',"INSTALL","\"INSTALL\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar1 = archive_read_next_header((archive *)paVar3,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'B',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3)
    ;
    iVar1 = archive_filter_code((archive *)paVar3,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'E',(long)iVar1,"archive_filter_code(a, 0)",0xb,"ARCHIVE_FILTER_LZOP",
                        (void *)0x0);
    pcVar4 = archive_filter_name((archive *)paVar3,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
               ,L'F',pcVar4,"archive_filter_name(a, 0)","lzop","\"lzop\"",(void *)0x0,L'\0');
    iVar1 = archive_format((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'G',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                        (void *)0x0);
    iVar1 = archive_read_close((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'J',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    paVar3 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                     ,L'O',(uint)(paVar3 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'P',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3
                       );
    iVar1 = archive_read_support_format_all((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'Q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3
                       );
    extract_reference_file(sample3);
    wVar2 = archive_read_open_filename(paVar3,sample3,2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'T',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, sample2, 2)"
                        ,paVar3);
    iVar1 = archive_read_next_header((archive *)paVar3,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
               ,L'W',"file1","\"file1\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar5 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'X',0x13,"19",lVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar3,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'Y',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
               ,L'Z',"file2","\"file2\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar5 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'[',0x40000,"262144",lVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar3,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'\\',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3)
    ;
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
               ,L']',"file3","\"file3\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar5 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'^',0x13,"19",lVar5,"archive_entry_size(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar3,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'a',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3)
    ;
    iVar1 = archive_filter_code((archive *)paVar3,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'd',(long)iVar1,"archive_filter_code(a, 0)",0xb,"ARCHIVE_FILTER_LZOP",
                        (void *)0x0);
    pcVar4 = archive_filter_name((archive *)paVar3,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
               ,L'e',pcVar4,"archive_filter_name(a, 0)","lzop","\"lzop\"",(void *)0x0,L'\0');
    iVar1 = archive_format((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'f',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                        (void *)0x0);
    iVar1 = archive_read_close((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'h',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'i',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    paVar3 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                     ,L'n',(uint)(paVar3 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    iVar1 = archive_read_support_filter_all((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'o',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3
                       );
    iVar1 = archive_read_support_format_all((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3
                       );
    extract_reference_file((char *)ae);
    wVar2 = archive_read_open_filename(paVar3,(char *)ae,2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L's',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, sample3, 2)"
                        ,paVar3);
    iVar1 = archive_read_next_header((archive *)paVar3,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'u',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
               ,L'v',"INSTALL","\"INSTALL\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar1 = archive_read_next_header((archive *)paVar3,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'y',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3)
    ;
    iVar1 = archive_filter_code((archive *)paVar3,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'|',(long)iVar1,"archive_filter_code(a, 0)",0xb,"ARCHIVE_FILTER_LZOP",
                        (void *)0x0);
    pcVar4 = archive_filter_name((archive *)paVar3,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
               ,L'}',pcVar4,"archive_filter_name(a, 0)","lzop","\"lzop\"",(void *)0x0,L'\0');
    iVar1 = archive_format((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'~',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                        (void *)0x0);
    iVar1 = archive_read_close((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'\x80',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzop.c"
                        ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_compat_lzop)
{
	const char *sample1 = "test_compat_lzop_1.tar.lzo";
	const char *sample2 = "test_compat_lzop_2.tar.lzo";
	const char *sample3 = "test_compat_lzop_3.tar.lzo";
	struct archive_entry *ae;
	struct archive *a;
	int r;

	/*
	 * Test1: tar ball compressed in one block.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_lzop(a);
	if (r == ARCHIVE_WARN) {
		skipping("lzop reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(sample1);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, sample1, 2));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("INSTALL", archive_entry_pathname(ae));

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LZOP);
	assertEqualString(archive_filter_name(a, 0), "lzop");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test2: tar ball compressed in multi blocks.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(sample2);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, sample2, 2));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file1", archive_entry_pathname(ae));
	assertEqualInt(19, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assertEqualInt(262144, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file3", archive_entry_pathname(ae));
	assertEqualInt(19, archive_entry_size(ae));

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LZOP);
	assertEqualString(archive_filter_name(a, 0), "lzop");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Test3: tar ball compressed in one block with junk data.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(sample3);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, sample3, 2));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("INSTALL", archive_entry_pathname(ae));

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LZOP);
	assertEqualString(archive_filter_name(a, 0), "lzop");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}